

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Option * __thiscall kj::Arena::allocate<kj::MainBuilder::Impl::Option>(Arena *this)

{
  Option *pOVar1;
  
  pOVar1 = (Option *)allocateBytes(this,0x40,8,false);
  (pOVar1->names).ptr = (OptionName *)0x0;
  (pOVar1->names).size_ = 0;
  *(undefined8 *)&pOVar1->hasArg = 0;
  (pOVar1->field_2).func = (Function<kj::MainBuilder::Validity_()> *)0x0;
  (pOVar1->argTitle).content.ptr = "";
  (pOVar1->argTitle).content.size_ = 1;
  (pOVar1->helpText).content.ptr = "";
  (pOVar1->helpText).content.size_ = 1;
  return pOVar1;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !KJ_HAS_TRIVIAL_DESTRUCTOR(T)));
  if (!KJ_HAS_TRIVIAL_CONSTRUCTOR(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}